

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::SaveLinearOffsetsSummary
          (BamStandardIndex *this,int *refId,int *numLinearOffsets)

{
  int iVar1;
  reference pvVar2;
  undefined4 extraout_var;
  
  pvVar2 = std::
           vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
           ::at(&this->m_indexFileSummary,(long)*refId);
  pvVar2->NumLinearOffsets = *numLinearOffsets;
  iVar1 = (*((this->m_resources).Device)->_vptr_IBamIODevice[7])();
  pvVar2->FirstLinearOffsetFilePosition = CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

void BamStandardIndex::SaveLinearOffsetsSummary(const int& refId, const int& numLinearOffsets)
{
    BaiReferenceSummary& refSummary = m_indexFileSummary.at(refId);
    refSummary.NumLinearOffsets = numLinearOffsets;
    refSummary.FirstLinearOffsetFilePosition = Tell();
}